

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

string * __thiscall
anon_unknown.dwarf_3c73d5::cmMacProjectDirectoryListGenerator::TransformNameBeforeCmp
          (string *__return_storage_ptr__,cmMacProjectDirectoryListGenerator *this,string *name)

{
  cmAlphaNum local_68;
  cmAlphaNum local_38;
  
  local_38.View_._M_str = (name->_M_dataplus)._M_p;
  local_38.View_._M_len = name->_M_string_length;
  local_68.View_._M_len = (this->Extension)._M_len;
  local_68.View_._M_str = (this->Extension)._M_str;
  cmStrCat<>(__return_storage_ptr__,&local_38,&local_68);
  return __return_storage_ptr__;
}

Assistant:

std::string TransformNameBeforeCmp(std::string name) override
  {
    return cmStrCat(name, this->Extension);
  }